

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t set_timefilter(archive_match *a,wchar_t timetype,time_t mtime_sec,long mtime_nsec,
                      time_t ctime_sec,long ctime_nsec)

{
  long ctime_nsec_local;
  time_t ctime_sec_local;
  long mtime_nsec_local;
  time_t mtime_sec_local;
  wchar_t timetype_local;
  archive_match *a_local;
  
  if ((timetype & 0x100U) != 0) {
    if (((timetype & 1U) != 0) || ((timetype & 0x13U) == 0x10)) {
      a->newer_mtime_filter = timetype;
      a->newer_mtime_sec = mtime_sec;
      a->newer_mtime_nsec = mtime_nsec;
      a->setflag = a->setflag | 2;
    }
    if (((timetype & 2U) != 0) || ((timetype & 0x13U) == 0x10)) {
      a->older_mtime_filter = timetype;
      a->older_mtime_sec = mtime_sec;
      a->older_mtime_nsec = mtime_nsec;
      a->setflag = a->setflag | 2;
    }
  }
  if ((timetype & 0x200U) != 0) {
    if (((timetype & 1U) != 0) || ((timetype & 0x13U) == 0x10)) {
      a->newer_ctime_filter = timetype;
      a->newer_ctime_sec = ctime_sec;
      a->newer_ctime_nsec = ctime_nsec;
      a->setflag = a->setflag | 2;
    }
    if (((timetype & 2U) != 0) || ((timetype & 0x13U) == 0x10)) {
      a->older_ctime_filter = timetype;
      a->older_ctime_sec = ctime_sec;
      a->older_ctime_nsec = ctime_nsec;
      a->setflag = a->setflag | 2;
    }
  }
  return L'\0';
}

Assistant:

static int
set_timefilter(struct archive_match *a, int timetype,
    time_t mtime_sec, long mtime_nsec, time_t ctime_sec, long ctime_nsec)
{
	if (timetype & ARCHIVE_MATCH_MTIME) {
		if ((timetype & ARCHIVE_MATCH_NEWER) || JUST_EQUAL(timetype)) {
			a->newer_mtime_filter = timetype;
			a->newer_mtime_sec = mtime_sec;
			a->newer_mtime_nsec = mtime_nsec;
			a->setflag |= TIME_IS_SET;
		}
		if ((timetype & ARCHIVE_MATCH_OLDER) || JUST_EQUAL(timetype)) {
			a->older_mtime_filter = timetype;
			a->older_mtime_sec = mtime_sec;
			a->older_mtime_nsec = mtime_nsec;
			a->setflag |= TIME_IS_SET;
		}
	}
	if (timetype & ARCHIVE_MATCH_CTIME) {
		if ((timetype & ARCHIVE_MATCH_NEWER) || JUST_EQUAL(timetype)) {
			a->newer_ctime_filter = timetype;
			a->newer_ctime_sec = ctime_sec;
			a->newer_ctime_nsec = ctime_nsec;
			a->setflag |= TIME_IS_SET;
		}
		if ((timetype & ARCHIVE_MATCH_OLDER) || JUST_EQUAL(timetype)) {
			a->older_ctime_filter = timetype;
			a->older_ctime_sec = ctime_sec;
			a->older_ctime_nsec = ctime_nsec;
			a->setflag |= TIME_IS_SET;
		}
	}
	return (ARCHIVE_OK);
}